

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O2

void __thiscall
Assimp::SplitByBoneCountProcess::SplitMesh
          (SplitByBoneCountProcess *this,aiMesh *pMesh,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *poNewMeshes)

{
  aiColor4D *paVar1;
  uint uVar2;
  aiBone *paVar3;
  pointer ppVar4;
  aiVector3D *paVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  pointer puVar21;
  pointer puVar22;
  bool bVar23;
  uint c;
  uint uVar24;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var25;
  aiMesh *paVar26;
  aiVector3D *paVar27;
  void *__s;
  aiColor4D *paVar28;
  ulong *puVar29;
  uint *puVar30;
  aiBone **ppaVar31;
  aiBone *this_00;
  aiVertexWeight *paVar32;
  aiFace *paVar33;
  ulong uVar34;
  uint b_1;
  uint uVar35;
  uint a;
  pointer pvVar36;
  long lVar37;
  ulong uVar38;
  uint b;
  uint uVar39;
  ulong uVar40;
  uint a_1;
  ulong uVar41;
  aiFace *paVar42;
  reference rVar43;
  aiMesh *newMesh;
  uint local_2c8;
  uint local_2c4;
  allocator_type local_2bd;
  value_type_conflict1 local_2bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newBonesAtCurrentFace;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subMeshFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mappedBoneIndex;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  vertexBones;
  vector<bool,_std::allocator<bool>_> isBoneUsed;
  vector<bool,_std::allocator<bool>_> isFaceHandled;
  vector<unsigned_int,_std::allocator<unsigned_int>_> previousVertexIndices;
  
  if (this->mMaxBoneCount < (ulong)pMesh->mNumBones) {
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector(&vertexBones,(ulong)pMesh->mNumVertices,(allocator_type *)&previousVertexIndices);
    for (uVar41 = 0; uVar41 < pMesh->mNumBones; uVar41 = uVar41 + 1) {
      paVar3 = pMesh->mBones[uVar41];
      for (uVar40 = 0; uVar40 < paVar3->mNumWeights; uVar40 = uVar40 + 1) {
        paVar32 = paVar3->mWeights;
        previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)uVar41;
        previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = paVar32[uVar40].mWeight;
        std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
        emplace_back<std::pair<unsigned_int,float>>
                  ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    *)(vertexBones.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + paVar32[uVar40].mVertexId),
                   (pair<unsigned_int,_float> *)&previousVertexIndices);
      }
    }
    previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         (uint)previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&isFaceHandled,(ulong)pMesh->mNumFaces,(bool *)&previousVertexIndices,
               (allocator_type *)&isBoneUsed);
    uVar24 = 0;
    while( true ) {
      if (pMesh->mNumFaces <= uVar24) break;
      previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           (uint)previousVertexIndices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0xffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&isBoneUsed,(ulong)pMesh->mNumBones,(bool *)&previousVertexIndices,
                 (allocator_type *)&mappedBoneIndex);
      subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&subMeshFaces,(ulong)pMesh->mNumFaces);
      newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8 = 0;
      local_2c4 = 0;
      for (previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start._0_4_ = 0; uVar41 = (ulong)local_2c4,
          (uint)previousVertexIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start < pMesh->mNumFaces;
          previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ =
               (uint)previousVertexIndices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1) {
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&isFaceHandled,
                            (ulong)(uint)previousVertexIndices.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if ((*rVar43._M_p & rVar43._M_mask) == 0) {
          paVar42 = pMesh->mFaces +
                    (uint)previousVertexIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
          for (uVar40 = 0; uVar40 < paVar42->mNumIndices; uVar40 = uVar40 + 1) {
            pvVar36 = vertexBones.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + paVar42->mIndices[uVar40];
            uVar39 = 0;
            while( true ) {
              ppVar4 = (pvVar36->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pvVar36->
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3) <=
                  (ulong)uVar39) break;
              mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = ppVar4[uVar39].first;
              rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&isBoneUsed,
                                  (ulong)(uint)mappedBoneIndex.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if (((*rVar43._M_p & rVar43._M_mask) == 0) &&
                 (_Var25 = std::
                           __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                     (newBonesAtCurrentFace.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      newBonesAtCurrentFace.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,&mappedBoneIndex),
                 _Var25._M_current ==
                 newBonesAtCurrentFace.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&newBonesAtCurrentFace,(value_type_conflict1 *)&mappedBoneIndex);
              }
              uVar39 = uVar39 + 1;
            }
          }
          if (((long)newBonesAtCurrentFace.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)newBonesAtCurrentFace.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + uVar41 <= this->mMaxBoneCount) {
            while (newBonesAtCurrentFace.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   newBonesAtCurrentFace.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
              uVar39 = newBonesAtCurrentFace.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1];
              newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   newBonesAtCurrentFace.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
              rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&isBoneUsed,(ulong)uVar39);
              if ((*rVar43._M_p & rVar43._M_mask) == 0) {
                rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&isBoneUsed,(ulong)uVar39);
                *rVar43._M_p = *rVar43._M_p | rVar43._M_mask;
                local_2c4 = local_2c4 + 1;
              }
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&subMeshFaces,(value_type_conflict1 *)&previousVertexIndices);
            uVar39 = paVar42->mNumIndices;
            rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&isFaceHandled,
                                (ulong)(uint)previousVertexIndices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
            local_2c8 = local_2c8 + uVar39;
            *rVar43._M_p = *rVar43._M_p | rVar43._M_mask;
            uVar24 = uVar24 + 1;
          }
        }
      }
      paVar26 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar26);
      newMesh = paVar26;
      if ((pMesh->mName).length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&previousVertexIndices);
        std::operator<<((ostream *)&previousVertexIndices,(pMesh->mName).data);
        std::operator<<((ostream *)&previousVertexIndices,"_sub");
        std::ostream::_M_insert<unsigned_long>((ulong)&previousVertexIndices);
        std::__cxx11::stringbuf::str();
        puVar21 = mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish < (pointer)0x400) {
          (paVar26->mName).length =
               (ai_uint32)
               mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          memcpy((paVar26->mName).data,
                 (void *)CONCAT44(mappedBoneIndex.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (uint)mappedBoneIndex.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start),
                 (size_t)mappedBoneIndex.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
          (paVar26->mName).data[(long)puVar21] = '\0';
        }
        std::__cxx11::string::~string((string *)&mappedBoneIndex);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&previousVertexIndices);
      }
      newMesh->mMaterialIndex = pMesh->mMaterialIndex;
      newMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(poNewMeshes,&newMesh);
      paVar26 = newMesh;
      newMesh->mNumVertices = local_2c8;
      newMesh->mNumFaces =
           (uint)((ulong)((long)subMeshFaces.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)subMeshFaces.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      uVar39 = newMesh->mNumVertices;
      uVar40 = (ulong)uVar39 * 0xc;
      paVar27 = (aiVector3D *)operator_new__(uVar40);
      if (uVar39 != 0) {
        uVar40 = uVar40 - 0xc;
        memset(paVar27,0,(uVar40 - uVar40 % 0xc) + 0xc);
      }
      paVar26->mVertices = paVar27;
      if ((pMesh->mNormals != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
        uVar39 = paVar26->mNumVertices;
        uVar40 = (ulong)uVar39 * 0xc;
        paVar27 = (aiVector3D *)operator_new__(uVar40);
        if (uVar39 != 0) {
          uVar40 = uVar40 - 0xc;
          memset(paVar27,0,(uVar40 - uVar40 % 0xc) + 0xc);
        }
        paVar26->mNormals = paVar27;
      }
      bVar23 = aiMesh::HasTangentsAndBitangents(pMesh);
      paVar26 = newMesh;
      if (bVar23) {
        uVar39 = newMesh->mNumVertices;
        uVar40 = (ulong)uVar39 * 0xc;
        paVar27 = (aiVector3D *)operator_new__(uVar40);
        if (uVar39 != 0) {
          uVar40 = uVar40 - 0xc;
          memset(paVar27,0,(uVar40 - uVar40 % 0xc) + 0xc);
        }
        paVar26->mTangents = paVar27;
        uVar39 = paVar26->mNumVertices;
        uVar40 = (ulong)uVar39 * 0xc;
        paVar27 = (aiVector3D *)operator_new__(uVar40);
        if (uVar39 != 0) {
          uVar40 = uVar40 - 0xc;
          memset(paVar27,0,(uVar40 - uVar40 % 0xc) + 0xc);
        }
        paVar26->mBitangents = paVar27;
      }
      for (lVar37 = 0; paVar26 = newMesh, lVar37 != 0x20; lVar37 = lVar37 + 4) {
        if ((*(long *)((long)pMesh->mTextureCoords + lVar37 * 2) != 0) && (pMesh->mNumVertices != 0)
           ) {
          uVar39 = newMesh->mNumVertices;
          uVar40 = (ulong)uVar39 * 0xc;
          __s = operator_new__(uVar40);
          if (uVar39 != 0) {
            uVar40 = uVar40 - 0xc;
            memset(__s,0,(uVar40 - uVar40 % 0xc) + 0xc);
          }
          *(void **)((long)paVar26->mTextureCoords + lVar37 * 2) = __s;
        }
        *(undefined4 *)((long)newMesh->mNumUVComponents + lVar37) =
             *(undefined4 *)((long)pMesh->mNumUVComponents + lVar37);
      }
      for (lVar37 = 0;
          puVar22 = subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
          puVar21 = subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start, paVar26 = newMesh, lVar37 != 8;
          lVar37 = lVar37 + 1) {
        if ((pMesh->mColors[lVar37] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
          uVar39 = newMesh->mNumVertices;
          uVar40 = (ulong)uVar39 << 4;
          paVar28 = (aiColor4D *)operator_new__(uVar40);
          if (uVar39 != 0) {
            memset(paVar28,0,uVar40);
          }
          paVar26->mColors[lVar37] = paVar28;
        }
      }
      uVar40 = (long)subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      puVar29 = (ulong *)operator_new__(-(ulong)(uVar40 >> 0x3c != 0) |
                                        ((long)subMeshFaces.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)subMeshFaces.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) * 4 + 8U);
      *puVar29 = uVar40;
      paVar42 = (aiFace *)(puVar29 + 1);
      if (puVar22 != puVar21) {
        paVar33 = paVar42;
        do {
          paVar33->mNumIndices = 0;
          paVar33->mIndices = (uint *)0x0;
          paVar33 = paVar33 + 1;
        } while (paVar33 != paVar42 + uVar40);
      }
      newMesh->mFaces = paVar42;
      uVar40 = (ulong)local_2c8;
      mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&previousVertexIndices,uVar40,(value_type_conflict1 *)&mappedBoneIndex,
                 (allocator_type *)&local_2bc);
      uVar39 = 0;
      uVar34 = 0;
      while( true ) {
        paVar26 = newMesh;
        uVar38 = (ulong)uVar39;
        if ((ulong)((long)subMeshFaces.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)subMeshFaces.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar38) break;
        paVar42 = pMesh->mFaces;
        uVar35 = subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar38];
        paVar33 = newMesh->mFaces;
        uVar2 = paVar42[uVar35].mNumIndices;
        paVar33[uVar38].mNumIndices = uVar2;
        puVar30 = (uint *)operator_new__((ulong)uVar2 << 2);
        paVar33 = paVar33 + uVar38;
        paVar33->mIndices = puVar30;
        for (uVar38 = 0; uVar38 < paVar33->mNumIndices; uVar38 = uVar38 + 1) {
          uVar2 = paVar42[uVar35].mIndices[uVar38];
          paVar33->mIndices[uVar38] = (uint)uVar34;
          *(uint *)(CONCAT44(previousVertexIndices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (uint)previousVertexIndices.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) + uVar34 * 4) = uVar2;
          paVar27 = pMesh->mVertices;
          paVar5 = newMesh->mVertices;
          paVar5[uVar34].z = paVar27[uVar2].z;
          paVar27 = paVar27 + uVar2;
          fVar6 = paVar27->y;
          paVar5 = paVar5 + uVar34;
          paVar5->x = paVar27->x;
          paVar5->y = fVar6;
          paVar27 = pMesh->mNormals;
          if ((paVar27 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
            paVar5 = newMesh->mNormals;
            paVar5[uVar34].z = paVar27[uVar2].z;
            fVar6 = paVar27[uVar2].y;
            paVar5 = paVar5 + uVar34;
            paVar5->x = paVar27[uVar2].x;
            paVar5->y = fVar6;
          }
          bVar23 = aiMesh::HasTangentsAndBitangents(pMesh);
          if (bVar23) {
            paVar27 = pMesh->mTangents;
            paVar5 = newMesh->mTangents;
            paVar5[uVar34].z = paVar27[uVar2].z;
            paVar27 = paVar27 + uVar2;
            fVar6 = paVar27->y;
            paVar5 = paVar5 + uVar34;
            paVar5->x = paVar27->x;
            paVar5->y = fVar6;
            paVar27 = pMesh->mBitangents;
            paVar5 = newMesh->mBitangents;
            paVar5[uVar34].z = paVar27[uVar2].z;
            paVar27 = paVar27 + uVar2;
            fVar6 = paVar27->y;
            paVar5 = paVar5 + uVar34;
            paVar5->x = paVar27->x;
            paVar5->y = fVar6;
          }
          for (lVar37 = 0; lVar37 != 8; lVar37 = lVar37 + 1) {
            paVar27 = pMesh->mTextureCoords[lVar37];
            if ((paVar27 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
              paVar5 = newMesh->mTextureCoords[lVar37];
              paVar5[uVar34].z = paVar27[uVar2].z;
              fVar6 = paVar27[uVar2].y;
              paVar5 = paVar5 + uVar34;
              paVar5->x = paVar27[uVar2].x;
              paVar5->y = fVar6;
            }
          }
          for (lVar37 = 0; lVar37 != 8; lVar37 = lVar37 + 1) {
            if ((pMesh->mColors[lVar37] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
              paVar28 = pMesh->mColors[lVar37] + uVar2;
              fVar6 = paVar28->g;
              fVar7 = paVar28->b;
              fVar8 = paVar28->a;
              paVar1 = newMesh->mColors[lVar37] + uVar34;
              paVar1->r = paVar28->r;
              paVar1->g = fVar6;
              paVar1->b = fVar7;
              paVar1->a = fVar8;
            }
          }
          uVar34 = (ulong)((uint)uVar34 + 1);
        }
        uVar39 = uVar39 + 1;
      }
      if ((uint)uVar34 != local_2c8) {
        __assert_fail("nvi == numSubMeshVertices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                      ,0x135,
                      "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                     );
      }
      newMesh->mNumBones = 0;
      ppaVar31 = (aiBone **)operator_new__(uVar41 << 3);
      paVar26->mBones = ppaVar31;
      local_2bc = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&mappedBoneIndex,(ulong)pMesh->mNumBones,&local_2bc,&local_2bd);
      for (uVar41 = 0; paVar26 = newMesh, uVar41 < pMesh->mNumBones; uVar41 = uVar41 + 1) {
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[](&isBoneUsed,uVar41);
        if ((*rVar43._M_p & rVar43._M_mask) != 0) {
          paVar3 = pMesh->mBones[uVar41];
          this_00 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(this_00);
          *(uint *)(CONCAT44(mappedBoneIndex.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (uint)mappedBoneIndex.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) + uVar41 * 4) =
               newMesh->mNumBones;
          uVar39 = newMesh->mNumBones;
          newMesh->mNumBones = uVar39 + 1;
          newMesh->mBones[uVar39] = this_00;
          if (this_00 != paVar3) {
            uVar39 = (paVar3->mName).length;
            (this_00->mName).length = uVar39;
            memcpy((this_00->mName).data,(paVar3->mName).data,(ulong)uVar39);
            (this_00->mName).data[uVar39] = '\0';
          }
          fVar17 = (paVar3->mOffsetMatrix).a1;
          fVar18 = (paVar3->mOffsetMatrix).a2;
          fVar19 = (paVar3->mOffsetMatrix).a3;
          fVar20 = (paVar3->mOffsetMatrix).a4;
          fVar13 = (paVar3->mOffsetMatrix).b1;
          fVar14 = (paVar3->mOffsetMatrix).b2;
          fVar15 = (paVar3->mOffsetMatrix).b3;
          fVar16 = (paVar3->mOffsetMatrix).b4;
          fVar9 = (paVar3->mOffsetMatrix).c1;
          fVar10 = (paVar3->mOffsetMatrix).c2;
          fVar11 = (paVar3->mOffsetMatrix).c3;
          fVar12 = (paVar3->mOffsetMatrix).c4;
          fVar6 = (paVar3->mOffsetMatrix).d2;
          fVar7 = (paVar3->mOffsetMatrix).d3;
          fVar8 = (paVar3->mOffsetMatrix).d4;
          (this_00->mOffsetMatrix).d1 = (paVar3->mOffsetMatrix).d1;
          (this_00->mOffsetMatrix).d2 = fVar6;
          (this_00->mOffsetMatrix).d3 = fVar7;
          (this_00->mOffsetMatrix).d4 = fVar8;
          (this_00->mOffsetMatrix).c1 = fVar9;
          (this_00->mOffsetMatrix).c2 = fVar10;
          (this_00->mOffsetMatrix).c3 = fVar11;
          (this_00->mOffsetMatrix).c4 = fVar12;
          (this_00->mOffsetMatrix).b1 = fVar13;
          (this_00->mOffsetMatrix).b2 = fVar14;
          (this_00->mOffsetMatrix).b3 = fVar15;
          (this_00->mOffsetMatrix).b4 = fVar16;
          (this_00->mOffsetMatrix).a1 = fVar17;
          (this_00->mOffsetMatrix).a2 = fVar18;
          (this_00->mOffsetMatrix).a3 = fVar19;
          (this_00->mOffsetMatrix).a4 = fVar20;
          this_00->mNumWeights = 0;
        }
      }
      if (newMesh->mNumBones != local_2c4) {
        __assert_fail("newMesh->mNumBones == numBones",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                      ,0x14b,
                      "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                     );
      }
      for (uVar41 = 0; uVar41 != uVar40; uVar41 = uVar41 + 1) {
        uVar39 = *(uint *)(CONCAT44(previousVertexIndices.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)previousVertexIndices.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) + uVar41 * 4);
        uVar35 = 0;
        while( true ) {
          ppVar4 = vertexBones.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar39].
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)vertexBones.
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar39].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3) <=
              (ulong)uVar35) break;
          uVar34 = (ulong)*(uint *)(CONCAT44(mappedBoneIndex.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (uint)mappedBoneIndex.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                   (ulong)ppVar4[uVar35].first * 4);
          if (uVar34 != 0xffffffff) {
            puVar30 = &newMesh->mBones[uVar34]->mNumWeights;
            *puVar30 = *puVar30 + 1;
          }
          uVar35 = uVar35 + 1;
        }
      }
      for (lVar37 = 0; (uint)lVar37 < paVar26->mNumBones; lVar37 = lVar37 + 1) {
        paVar3 = paVar26->mBones[lVar37];
        if ((ulong)paVar3->mNumWeights == 0) {
          __assert_fail("bone->mNumWeights > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                        ,0x15f,
                        "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                       );
        }
        uVar41 = (ulong)paVar3->mNumWeights << 3;
        paVar32 = (aiVertexWeight *)operator_new__(uVar41);
        memset(paVar32,0,uVar41);
        paVar3->mWeights = paVar32;
        paVar3->mNumWeights = 0;
      }
      for (uVar41 = 0; uVar41 != uVar40; uVar41 = uVar41 + 1) {
        pvVar36 = vertexBones.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  *(uint *)(CONCAT44(previousVertexIndices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint)previousVertexIndices.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + uVar41 * 4);
        uVar39 = 0;
        while( true ) {
          uVar34 = (ulong)uVar39;
          ppVar4 = (pvVar36->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pvVar36->
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3) <=
              uVar34) break;
          uVar38 = (ulong)*(uint *)(CONCAT44(mappedBoneIndex.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (uint)mappedBoneIndex.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                   (ulong)ppVar4[uVar34].first * 4);
          if (uVar38 == 0xffffffff) {
            __assert_fail("newBoneIndex != std::numeric_limits<unsigned int>::max()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                          ,0x170,
                          "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                         );
          }
          paVar3 = newMesh->mBones[uVar38];
          paVar32 = paVar3->mWeights;
          uVar35 = paVar3->mNumWeights;
          paVar3->mNumWeights = uVar35 + 1;
          paVar32[uVar35].mVertexId = (uint)uVar41;
          paVar32[uVar35].mWeight =
               (pvVar36->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar34].second;
          uVar39 = uVar39 + 1;
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&previousVertexIndices.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&newBonesAtCurrentFace.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&isBoneUsed.super__Bvector_base<std::allocator<bool>_>);
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&isFaceHandled.super__Bvector_base<std::allocator<bool>_>);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector(&vertexBones);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::SplitMesh( const aiMesh* pMesh, std::vector<aiMesh*>& poNewMeshes) const
{
    // skip if not necessary
    if( pMesh->mNumBones <= mMaxBoneCount )
        return;

    // necessary optimisation: build a list of all affecting bones for each vertex
    // TODO: (thom) maybe add a custom allocator here to avoid allocating tens of thousands of small arrays
    typedef std::pair<unsigned int, float> BoneWeight;
    std::vector< std::vector<BoneWeight> > vertexBones( pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumBones; ++a)
    {
        const aiBone* bone = pMesh->mBones[a];
        for( unsigned int b = 0; b < bone->mNumWeights; ++b)
            vertexBones[ bone->mWeights[b].mVertexId ].push_back( BoneWeight( a, bone->mWeights[b].mWeight));
    }

    unsigned int numFacesHandled = 0;
    std::vector<bool> isFaceHandled( pMesh->mNumFaces, false);
    while( numFacesHandled < pMesh->mNumFaces )
    {
        // which bones are used in the current submesh
        unsigned int numBones = 0;
        std::vector<bool> isBoneUsed( pMesh->mNumBones, false);
        // indices of the faces which are going to go into this submesh
        std::vector<unsigned int> subMeshFaces;
        subMeshFaces.reserve( pMesh->mNumFaces);
        // accumulated vertex count of all the faces in this submesh
        unsigned int numSubMeshVertices = 0;
        // a small local array of new bones for the current face. State of all used bones for that face
        // can only be updated AFTER the face is completely analysed. Thanks to imre for the fix.
        std::vector<unsigned int> newBonesAtCurrentFace;

        // add faces to the new submesh as long as all bones affecting the faces' vertices fit in the limit
        for( unsigned int a = 0; a < pMesh->mNumFaces; ++a)
        {
            // skip if the face is already stored in a submesh
            if( isFaceHandled[a] )
                continue;

            const aiFace& face = pMesh->mFaces[a];
            // check every vertex if its bones would still fit into the current submesh
            for( unsigned int b = 0; b < face.mNumIndices; ++b )
            {
                const std::vector<BoneWeight>& vb = vertexBones[face.mIndices[b]];
                for( unsigned int c = 0; c < vb.size(); ++c)
                {
                    unsigned int boneIndex = vb[c].first;
                    // if the bone is already used in this submesh, it's ok
                    if( isBoneUsed[boneIndex] )
                        continue;

                    // if it's not used, yet, we would need to add it. Store its bone index
                    if( std::find( newBonesAtCurrentFace.begin(), newBonesAtCurrentFace.end(), boneIndex) == newBonesAtCurrentFace.end() )
                        newBonesAtCurrentFace.push_back( boneIndex);
                }
            }

            // leave out the face if the new bones required for this face don't fit the bone count limit anymore
            if( numBones + newBonesAtCurrentFace.size() > mMaxBoneCount )
                continue;

            // mark all new bones as necessary
            while( !newBonesAtCurrentFace.empty() )
            {
                unsigned int newIndex = newBonesAtCurrentFace.back();
                newBonesAtCurrentFace.pop_back(); // this also avoids the deallocation which comes with a clear()
                if( isBoneUsed[newIndex] )
                    continue;

                isBoneUsed[newIndex] = true;
                numBones++;
            }

            // store the face index and the vertex count
            subMeshFaces.push_back( a);
            numSubMeshVertices += face.mNumIndices;

            // remember that this face is handled
            isFaceHandled[a] = true;
            numFacesHandled++;
        }

        // create a new mesh to hold this subset of the source mesh
        aiMesh* newMesh = new aiMesh;
        if( pMesh->mName.length > 0 )
            newMesh->mName.Set( format() << pMesh->mName.data << "_sub" << poNewMeshes.size());
        newMesh->mMaterialIndex = pMesh->mMaterialIndex;
        newMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;
        poNewMeshes.push_back( newMesh);

        // create all the arrays for this mesh if the old mesh contained them
        newMesh->mNumVertices = numSubMeshVertices;
        newMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
        newMesh->mVertices = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasNormals() )
            newMesh->mNormals = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasTangentsAndBitangents() )
        {
            newMesh->mTangents = new aiVector3D[newMesh->mNumVertices];
            newMesh->mBitangents = new aiVector3D[newMesh->mNumVertices];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( pMesh->HasTextureCoords( a) )
                newMesh->mTextureCoords[a] = new aiVector3D[newMesh->mNumVertices];
            newMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( pMesh->HasVertexColors( a) )
                newMesh->mColors[a] = new aiColor4D[newMesh->mNumVertices];
        }

        // and copy over the data, generating faces with linear indices along the way
        newMesh->mFaces = new aiFace[subMeshFaces.size()];
        unsigned int nvi = 0; // next vertex index
        std::vector<unsigned int> previousVertexIndices( numSubMeshVertices, std::numeric_limits<unsigned int>::max()); // per new vertex: its index in the source mesh
        for( unsigned int a = 0; a < subMeshFaces.size(); ++a )
        {
            const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
            aiFace& dstFace = newMesh->mFaces[a];
            dstFace.mNumIndices = srcFace.mNumIndices;
            dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

            // accumulate linearly all the vertices of the source face
            for( unsigned int b = 0; b < dstFace.mNumIndices; ++b )
            {
                unsigned int srcIndex = srcFace.mIndices[b];
                dstFace.mIndices[b] = nvi;
                previousVertexIndices[nvi] = srcIndex;

                newMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
                if( pMesh->HasNormals() )
                    newMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
                if( pMesh->HasTangentsAndBitangents() )
                {
                    newMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
                    newMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++c )
                {
                    if( pMesh->HasTextureCoords( c) )
                        newMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c )
                {
                    if( pMesh->HasVertexColors( c) )
                        newMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
                }

                nvi++;
            }
        }

        ai_assert( nvi == numSubMeshVertices );

        // Create the bones for the new submesh: first create the bone array
        newMesh->mNumBones = 0;
        newMesh->mBones = new aiBone*[numBones];

        std::vector<unsigned int> mappedBoneIndex( pMesh->mNumBones, std::numeric_limits<unsigned int>::max());
        for( unsigned int a = 0; a < pMesh->mNumBones; ++a )
        {
            if( !isBoneUsed[a] )
                continue;

            // create the new bone
            const aiBone* srcBone = pMesh->mBones[a];
            aiBone* dstBone = new aiBone;
            mappedBoneIndex[a] = newMesh->mNumBones;
            newMesh->mBones[newMesh->mNumBones++] = dstBone;
            dstBone->mName = srcBone->mName;
            dstBone->mOffsetMatrix = srcBone->mOffsetMatrix;
            dstBone->mNumWeights = 0;
        }

        ai_assert( newMesh->mNumBones == numBones );

        // iterate over all new vertices and count which bones affected its old vertex in the source mesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a )
        {
            unsigned int oldIndex = previousVertexIndices[a];
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[oldIndex];

            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b )
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                if( newBoneIndex != std::numeric_limits<unsigned int>::max() )
                    newMesh->mBones[newBoneIndex]->mNumWeights++;
            }
        }

        // allocate all bone weight arrays accordingly
        for( unsigned int a = 0; a < newMesh->mNumBones; ++a )
        {
            aiBone* bone = newMesh->mBones[a];
            ai_assert( bone->mNumWeights > 0 );
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            bone->mNumWeights = 0; // for counting up in the next step
        }

        // now copy all the bone vertex weights for all the vertices which made it into the new submesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a)
        {
            // find the source vertex for it in the source mesh
            unsigned int previousIndex = previousVertexIndices[a];
            // these bones were affecting it
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[previousIndex];
            // all of the bones affecting it should be present in the new submesh, or else
            // the face it comprises shouldn't be present
            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b)
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                ai_assert( newBoneIndex != std::numeric_limits<unsigned int>::max() );
                aiVertexWeight* dstWeight = newMesh->mBones[newBoneIndex]->mWeights + newMesh->mBones[newBoneIndex]->mNumWeights;
                newMesh->mBones[newBoneIndex]->mNumWeights++;

                dstWeight->mVertexId = a;
                dstWeight->mWeight = bonesOnThisVertex[b].second;
            }
        }

        // I have the strange feeling that this will break apart at some point in time...
    }
}